

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

double generateGaussianNoise(double mu,double sigma)

{
  int iVar1;
  long *in_FS_OFFSET;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double z0;
  double u2;
  double u1;
  undefined8 local_8;
  
  *(byte *)(*in_FS_OFFSET + -8) = (*(byte *)(*in_FS_OFFSET + -8) ^ 0xff) & 1;
  if ((*(byte *)(*in_FS_OFFSET + -8) & 1) == 0) {
    dVar3 = *(double *)(*in_FS_OFFSET + -0x10);
  }
  else {
    do {
      iVar1 = rand();
      dVar2 = (double)iVar1 * 4.656612875245797e-10;
      iVar1 = rand();
    } while (dVar2 <= 2.2250738585072014e-308);
    dVar3 = log(dVar2);
    dVar3 = sqrt(dVar3 * -2.0);
    dVar4 = cos((double)iVar1 * 4.656612875245797e-10 * 6.283185307179586);
    dVar3 = dVar3 * dVar4;
    dVar2 = log(dVar2);
    dVar2 = sqrt(dVar2 * -2.0);
    dVar4 = sin((double)iVar1 * 4.656612875245797e-10 * 6.283185307179586);
    *(double *)(*in_FS_OFFSET + -0x10) = dVar2 * dVar4;
  }
  local_8 = dVar3 * in_XMM1_Qa + in_XMM0_Qa;
  return local_8;
}

Assistant:

double generateGaussianNoise(double mu, double sigma) {
    static const double epsilon = std::numeric_limits<double>::min();
    static const double two_pi = 2.0 * 3.14159265358979323846;

    thread_local double z1;
    thread_local bool generate;
    generate = !generate;

    if (!generate)
        return z1 * sigma + mu;

    double u1, u2;
    do {
        u1 = rand() * (1.0 / RAND_MAX);
        u2 = rand() * (1.0 / RAND_MAX);
    } while (u1 <= epsilon);

    double z0;
    z0 = sqrt(-2.0 * log(u1)) * cos(two_pi * u2);
    z1 = sqrt(-2.0 * log(u1)) * sin(two_pi * u2);
    return z0 * sigma + mu;
}